

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserequationast.cpp
# Opt level: O0

void __thiscall libcellml::AnalyserEquationAst::AnalyserEquationAst(AnalyserEquationAst *this)

{
  AnalyserEquationAstImpl *this_00;
  AnalyserEquationAst *this_local;
  
  this_00 = (AnalyserEquationAstImpl *)operator_new(0x88);
  memset(this_00,0,0x88);
  AnalyserEquationAstImpl::AnalyserEquationAstImpl(this_00);
  this->mPimpl = this_00;
  return;
}

Assistant:

AnalyserEquationAst::AnalyserEquationAst()
    : mPimpl(new AnalyserEquationAstImpl())
{
}